

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

int C_std::Network::easy_bind(int sockfd,int port,string *ip)

{
  int iVar1;
  char *__cp;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  int local_2c;
  undefined1 local_28 [4];
  int ret;
  sockaddr_in addr;
  string *ip_local;
  int port_local;
  int sockfd_local;
  
  addr.sin_zero = (uchar  [8])ip;
  memset(local_28,0,0x10);
  local_28._0_2_ = 2;
  local_28._2_2_ = htons((uint16_t)port);
  __cp = (char *)std::__cxx11::string::c_str();
  local_2c = inet_pton(2,__cp,&ret);
  if (local_2c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"ip convert error",&local_51);
    perror_exit((string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else if (local_2c == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"af to ip error",&local_89);
    perror_exit((string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  iVar1 = Bind(sockfd,(sockaddr *)local_28,0x10);
  return iVar1;
}

Assistant:

int easy_bind(int sockfd, int port, const std::string ip) {
            struct sockaddr_in addr;
            memset(&addr, 0, sizeof(addr));
            addr.sin_family = AF_INET;
            addr.sin_port = htons(port);                //需要转换成网络字节序：大端模式
            //如果ip为127.0.0.1，则等价于addr.sin_addr.s_addr = htol(INADDR_ANY);
            int ret = inet_pton(AF_INET, ip.c_str(), &addr.sin_addr.s_addr);
            if (ret == 0) {
                perror_exit("ip convert error");    //src不包含代表指定地址族中有效网络地址的字符串
            } else if(ret == -1){
                perror_exit("af to ip error");            //af不包含有效的地址族
            }
            return Bind(sockfd, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr));
        }